

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O3

int tnt_reply(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  char *local_48;
  void *ptr [2];
  size_t local_30;
  size_t offv;
  size_t length;
  
  iVar1 = tnt_reply_len(buf,size,&offv);
  local_30 = offv;
  if (iVar1 == 0) {
    if (r == (tnt_reply *)0x0) {
      iVar1 = 0;
    }
    else {
      ptr[0] = &local_30;
      local_30 = 0;
      local_48 = buf;
      iVar1 = tnt_reply_from(r,tnt_reply_cb,&local_48);
    }
  }
  else {
    if (iVar1 != 1) {
      return -1;
    }
    iVar1 = 1;
  }
  if (off != (size_t *)0x0) {
    *off = local_30;
  }
  return iVar1;
}

Assistant:

int
tnt_reply(struct tnt_reply *r, char *buf, size_t size, size_t *off) {
	/* supplied buffer must contain full reply,
	 * if it doesn't then returning count of bytes
	 * needed to process */
	size_t length;
	switch (tnt_reply_len(buf, size, &length)) {
	case 0:
		break;
	case 1:
		if (off)
			*off = length;
		return 1;
	default:
		return -1;
	}
	if (r == NULL) {
		if (off)
			*off = length;
		return 0;
	}
	size_t offv = 0;
	void *ptr[2] = { buf, &offv };
	int rc = tnt_reply_from(r, (tnt_reply_t)tnt_reply_cb, ptr);
	if (off)
		*off = offv;
	return rc;
}